

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O0

message<MsgType> * __thiscall
blcl::net::tsqueue<blcl::net::message<MsgType>_>::front(tsqueue<blcl::net::message<MsgType>_> *this)

{
  reference pvVar1;
  scoped_lock<std::mutex> local_18;
  scoped_lock<std::mutex> lock;
  tsqueue<blcl::net::message<MsgType>_> *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::scoped_lock<std::mutex>::scoped_lock(&local_18,&this->queue_mtx_);
  pvVar1 = std::deque<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>::
           front(&this->raw_deque_);
  std::scoped_lock<std::mutex>::~scoped_lock(&local_18);
  return pvVar1;
}

Assistant:

const T& front() {
            std::scoped_lock lock(queue_mtx_);
            return raw_deque_.front();
        }